

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Creature.cpp
# Opt level: O3

double __thiscall Creature::make_fitness(Creature *this)

{
  shared_count *this_00;
  Chromosome *this_01;
  int iVar1;
  World *pWVar2;
  pointer psVar3;
  genes_t *pgVar4;
  undefined4 extraout_var;
  ulong gene;
  size_t chrom;
  _func_int **pp_Var5;
  double dVar6;
  shared_ptr<Chromosome> chr;
  vector<boost::any,_std::allocator<boost::any>_> av;
  double local_40;
  any local_38;
  
  local_40 = 0.0;
  if (((this->pntpop != (Population *)0x0) &&
      (pWVar2 = Population::get_world(this->pntpop), pWVar2 != (World *)0x0)) &&
     (psVar3 = (this->chroms).
               super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (this->chroms).
     super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
     ._M_impl.super__Vector_impl_data._M_finish != psVar3)) {
    local_40 = 0.0;
    chrom = 0;
    this_00 = &chr.pn;
    do {
      this_01 = psVar3[chrom].px;
      chr.px = (element_type *)psVar3[chrom].pn.pi_;
      if (chr.px != (element_type *)0x0) {
        LOCK();
        *(uint_least32_t *)&(chr.px)->CHROMOSOME_SIZE =
             (uint_least32_t)(chr.px)->CHROMOSOME_SIZE + 1;
        UNLOCK();
      }
      if (this_01 == (Chromosome *)0x0) {
LAB_0010ec50:
        __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                      "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<Chromosome>::operator->() const [T = Chromosome]"
                     );
      }
      gene = 0;
      while (pgVar4 = Chromosome::get_genes(this_01),
            gene < (ulong)((long)(pgVar4->
                                 super__Vector_base<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pgVar4->
                                 super__Vector_base<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start >> 3)) {
        chr.pn.pi_ = (sp_counted_base *)0x0;
        pp_Var5 = (_func_int **)get_phenotype(this,chrom,gene,0);
        local_38.content = (placeholder *)operator_new(0x10);
        (local_38.content)->_vptr_placeholder = (_func_int **)&PTR__placeholder_0011d848;
        local_38.content[1]._vptr_placeholder = pp_Var5;
        std::vector<boost::any,_std::allocator<boost::any>_>::_M_realloc_insert<boost::any>
                  ((vector<boost::any,_std::allocator<boost::any>_> *)this_00,(iterator)0x0,
                   &local_38);
        if (local_38.content != (placeholder *)0x0) {
          (*(local_38.content)->_vptr_placeholder[1])();
        }
        if (this_01 == (Chromosome *)0x0) goto LAB_0010ec50;
        pp_Var5 = (_func_int **)get_phenotype(this,chrom,gene,this_01->ALLELE_SIZE);
        local_38.content = (placeholder *)operator_new(0x10);
        (local_38.content)->_vptr_placeholder = (_func_int **)&PTR__placeholder_0011d848;
        local_38.content[1]._vptr_placeholder = pp_Var5;
        std::vector<boost::any,_std::allocator<boost::any>_>::_M_realloc_insert<boost::any>
                  ((vector<boost::any,_std::allocator<boost::any>_> *)this_00,(iterator)0x0,
                   &local_38);
        if (local_38.content != (placeholder *)0x0) {
          (*(local_38.content)->_vptr_placeholder[1])();
        }
        iVar1 = (*pWVar2->_vptr_World[6])(pWVar2);
        dVar6 = (double)(*(code *)CONCAT44(extraout_var,iVar1))(this_00);
        local_40 = local_40 + dVar6;
        std::vector<boost::any,_std::allocator<boost::any>_>::~vector
                  ((vector<boost::any,_std::allocator<boost::any>_> *)this_00);
        gene = gene + 1;
        if (this_01 == (Chromosome *)0x0) goto LAB_0010ec50;
      }
      boost::detail::shared_count::~shared_count((shared_count *)&chr);
      chrom = chrom + 1;
      psVar3 = (this->chroms).
               super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (chrom < (ulong)((long)(this->chroms).
                                   super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4));
  }
  return local_40;
}

Assistant:

double Creature::make_fitness()
{
	if(!pntpop)
		return 0;

	const World* wld = pntpop->get_world();
	if(!wld)
		return 0;

	double ret = 0;

	for(size_t h = 0; h < chroms.size(); ++h)
	{
		boost::shared_ptr<Chromosome> chr = chroms[h];

		for(size_t i = 0; i < chr->get_genes().size(); ++i)
		{
			std::vector<any> av;
			av.push_back(get_phenotype(h, i, 0));
			av.push_back(get_phenotype(h, i, chr->ALLELE_SIZE));

			ret += (wld->get_fitfun())(av);
		}
	}

	return ret;

}